

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineinput.cpp
# Opt level: O1

void __thiscall CLineInput::UpdateStrData(CLineInput *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  str_utf8_stats(this->m_pStr,this->m_MaxSize,this->m_MaxChars,&this->m_Len,&this->m_NumChars);
  iVar1 = this->m_Len;
  iVar2 = this->m_CursorPos;
  if (iVar1 < iVar2 || iVar2 < 0) {
    if (iVar2 < iVar1) {
      iVar1 = iVar2;
    }
    iVar3 = 0;
    if (-1 < iVar2) {
      iVar3 = iVar1;
    }
    this->m_CursorPos = iVar3;
    this->m_SelectionEnd = iVar3;
    this->m_SelectionStart = iVar3;
  }
  return;
}

Assistant:

void CLineInput::UpdateStrData()
{
	str_utf8_stats(m_pStr, m_MaxSize, m_MaxChars, &m_Len, &m_NumChars);
	if(m_CursorPos < 0 || m_CursorPos > m_Len)
		SetCursorOffset(m_CursorPos);
}